

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# negative_binomial_dist.hpp
# Opt level: O3

int __thiscall trng::negative_binomial_dist::operator()(negative_binomial_dist *this,lcg64_shift *r)

{
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint x;
  ulong uVar6;
  double dVar7;
  double local_18;
  
  uVar2 = (r->S).r * (r->P).a + (r->P).b;
  uVar4 = uVar2 >> 0x11 ^ uVar2;
  uVar4 = uVar4 << 0x1f ^ uVar4;
  local_18 = (double)(uVar4 >> 1 ^ uVar4 >> 9) * 1.0842021724855042e-19;
  (r->S).r = uVar2;
  pdVar1 = (this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  if (*pdVar1 <= local_18) {
    uVar2 = lVar3 - 1;
    if (2 < lVar3) {
      uVar4 = 0;
      do {
        uVar6 = (long)(uVar4 + uVar2) / 2;
        uVar5 = uVar6;
        if (local_18 <= pdVar1[uVar6]) {
          uVar5 = uVar4;
          uVar2 = uVar6;
        }
        uVar4 = uVar5;
      } while (1 < (long)(uVar2 - uVar5));
    }
  }
  else {
    uVar2 = 0;
  }
  if (uVar2 + 1 == lVar3) {
    dVar7 = param_type::cdf(&this->P,(int)uVar2);
    while (local_18 = local_18 - dVar7, 0.0 < local_18) {
      x = (int)uVar2 + 1;
      uVar2 = (ulong)x;
      dVar7 = param_type::pdf(&this->P,x);
    }
  }
  return (int)uVar2;
}

Assistant:

int operator()(R &r) {
      double p{utility::uniformco<double>(r)};
      const std::size_t x{utility::discrete(p, P.P_.begin(), P.P_.end())};
      int x_i{static_cast<int>(x)};
      if (x + 1 == P.P_.size()) {
        p -= cdf(x_i);
        while (p > 0) {
          ++x_i;
          p -= pdf(x_i);
        }
      }
      return x_i;
    }